

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O2

void __thiscall biosoup::Sequence::~Sequence(Sequence *this)

{
  std::__cxx11::string::~string((string *)&this->quality);
  std::__cxx11::string::~string((string *)&this->data);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

~Sequence() = default;